

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

bool __thiscall DynamicHistogram<double>::merge(DynamicHistogram<double> *this)

{
  FixedSizeCache<double> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  char cVar1;
  int iVar2;
  reference pvVar3;
  int i;
  int index;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  value_type_conflict2 local_30;
  
  cVar1 = this->_initialized;
  if ((this->_cache)._count != 0) {
    this_00 = &this->_cache;
    if ((bool)cVar1 == false) {
      dVar4 = FixedSizeCache<double>::max(this_00);
      this->_binMax = dVar4;
      dVar4 = FixedSizeCache<double>::min(this_00);
      this->_binMin = dVar4;
      this->_binWidth = (this->_binMax - dVar4) / (double)this->_binCount;
      for (iVar2 = 0; iVar2 < this_00->_count; iVar2 = iVar2 + 1) {
        dVar4 = FixedSizeCache<double>::at(this_00,iVar2);
        add_(this,dVar4);
      }
      FixedSizeCache<double>::reset(this_00);
      this->_initialized = true;
    }
    else {
      this->_numMerges = this->_numMerges + 1;
      dVar4 = FixedSizeCache<double>::min(this_00);
      iVar2 = index_(this,dVar4);
      dVar4 = this->_binWidth;
      dVar8 = this->_binMin;
      dVar5 = FixedSizeCache<double>::min(this_00);
      index_(this,dVar5);
      dVar6 = this->_binWidth * -0.5 + ((double)iVar2 + 0.5) * dVar4 + dVar8;
      dVar4 = FixedSizeCache<double>::max(this_00);
      iVar2 = index_(this,dVar4);
      dVar4 = this->_binWidth;
      dVar8 = this->_binMin;
      dVar5 = FixedSizeCache<double>::max(this_00);
      index_(this,dVar5);
      dVar5 = this->_binWidth;
      dVar7 = dVar5 * 0.5 + ((double)iVar2 + 0.5) * dVar4 + dVar8;
      dVar4 = this->_binMin;
      dVar8 = this->_binMax;
      dVar9 = dVar8;
      if (dVar8 <= dVar7) {
        dVar9 = dVar7;
      }
      dVar7 = dVar4;
      if (dVar6 <= dVar4) {
        dVar7 = dVar6;
      }
      dVar4 = ceil((dVar9 - dVar7) / (dVar8 - dVar4));
      iVar2 = this->_binCount;
      dVar4 = (double)((int)dVar4 * iVar2) * dVar5;
      dVar7 = dVar7 - (double)((int)(((dVar4 + dVar7) - dVar9) / dVar5) / 2) * dVar5;
      dVar4 = dVar4 + dVar7;
      dVar8 = (dVar4 - dVar7) / (double)iVar2;
      this_01 = &this->_temp;
      for (index = 0; index < iVar2; index = index + 1) {
        dVar5 = this->_binWidth;
        dVar9 = this->_binMin;
        dVar6 = frequency_(this,index);
        pvVar3 = std::vector<double,_std::allocator<double>_>::at
                           (this_01,(long)(int)(((((double)index + 0.5) * dVar5 + dVar9) - dVar7) /
                                               dVar8));
        *pvVar3 = dVar6 + *pvVar3;
        iVar2 = this->_binCount;
      }
      std::_Vector_base<double,_std::allocator<double>_>::_Vector_impl_data::_M_swap_data
                ((_Vector_impl_data *)this_01,(_Vector_impl_data *)&this->_frequencies);
      local_30 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (this_01,(long)(this->_temp).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->_temp).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3,&local_30);
      this->_binMax = dVar4;
      this->_binMin = dVar7;
      this->_binWidth = dVar8;
      for (iVar2 = 0; iVar2 < this_00->_count; iVar2 = iVar2 + 1) {
        dVar4 = FixedSizeCache<double>::at(this_00,iVar2);
        add_(this,dVar4);
      }
      FixedSizeCache<double>::reset(this_00);
    }
    cVar1 = '\x01';
  }
  return (bool)cVar1;
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }